

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O3

int str_to_int(char *str,int *value)

{
  long lVar1;
  int __base;
  int iVar2;
  char *str_end;
  char *local_20;
  
  iVar2 = 1;
  if (*str != '\0') {
    __base = 0;
    if (*str == '$') {
      str = str + 1;
      __base = 0x10;
    }
    lVar1 = strtol(str,&local_20,__base);
    if (*local_20 == '\0') {
      iVar2 = 0;
      if (value != (int *)0x0) {
        *value = (int)lVar1;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int str_to_int(const char *str, int *value)
{
    int status = 0;
    do {
        char *str_end;
        long lval;

        /* base 0 is auto detect */
        int base = 0;

        if (*str == '\0')
        {
            /* no string to parse */
            status = 1;
            break;
        }

        if (*str == '$')
        {
            /* a $ prefix specifies base 16 */
            ++str;
            base = 16;
        }

        lval = strtol(str, &str_end, base);

        if(*str_end != '\0')
        {
            /* there is garbage in the string */
            status = 1;
            break;
        }

        if(value != NULL)
        {
            /* all is well, set the out parameter */
            *value = (int)lval;
        }
    } while(0);

    return status;
}